

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UShrtField.cpp
# Opt level: O0

void __thiscall
ki::dml::Field<unsigned_short>::read_from(Field<unsigned_short> *this,istream *istream)

{
  ulong uVar1;
  ostream *poVar2;
  parse_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  unsigned_short local_1c;
  undefined2 local_1a;
  ValueBytes<unsigned_short> data;
  istream *piStack_18;
  ValueBytes<unsigned_short> endianness_check;
  istream *istream_local;
  Field<unsigned_short> *this_local;
  
  piStack_18 = istream;
  istream_local = (istream *)this;
  ValueBytes<unsigned_short>::ValueBytes((ValueBytes<unsigned_short> *)&local_1a);
  local_1a = 0x102;
  ValueBytes<unsigned_short>::ValueBytes((ValueBytes<unsigned_short> *)&local_1c);
  std::istream::read((char *)piStack_18,(long)&local_1c);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    if (local_1a._0_1_ == (ValueBytes<unsigned_short>)0x1) {
      std::reverse<char*>((char *)&local_1c,(char *)&local_1a);
    }
    this->m_value = local_1c;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,
                           "Not enough data was available to read USHRT value (");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_FieldBase).m_name);
  std::operator<<(poVar2,").");
  this_00 = (parse_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  parse_error::parse_error(this_00,local_1c8);
  __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void UShrtField::read_from(std::istream &istream)
	{
		ValueBytes<USHRT> endianness_check;
		endianness_check.value = 0x0102;
		ValueBytes<USHRT> data;
		istream.read(data.buff, sizeof(USHRT));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read USHRT value (" << m_name << ").";
			throw parse_error(oss.str());
		}

		if (endianness_check.buff[0] == 0x01)
			std::reverse(&data.buff[0], &data.buff[2]);
		m_value = data.value;
	}